

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O1

bool crnlib::image_utils::read_from_stream_stb(data_stream_serializer *serializer,image_u8 *img)

{
  uint uVar1;
  stbi_uc *psVar2;
  stbi_uc sVar3;
  stbi_uc sVar4;
  stbi_uc sVar5;
  color_quad<unsigned_char,_int> *pcVar6;
  int iVar7;
  bool bVar8;
  byte bVar9;
  uint uVar11;
  stbi_uc *retval_from_stbi_load;
  int iVar12;
  bool bVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  stbi_uc sVar17;
  uint uVar18;
  int y;
  int x;
  int n;
  uint8_vec buf;
  uint local_54;
  uint local_50;
  int local_4c;
  vector<unsigned_char> local_48;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_34;
  byte bVar10;
  
  local_48.m_p = (stbi_uc *)0x0;
  local_48.m_size = 0;
  local_48.m_capacity = 0;
  bVar8 = data_stream::read_array(serializer->m_pStream,&local_48);
  bVar13 = false;
  if (bVar8) {
    local_50 = 0;
    local_54 = 0;
    local_4c = 0;
    retval_from_stbi_load =
         stbi_load_from_memory
                   (local_48.m_p,local_48.m_size,(int *)&local_50,(int *)&local_54,&local_4c,4);
    iVar7 = local_4c;
    if (retval_from_stbi_load != (stbi_uc *)0x0) {
      if ((int)local_54 < 0x4001 && (int)local_50 < 0x4001) {
        uVar1 = local_4c - 2;
        local_34.m_u32 = 0xff000000;
        image<crnlib::color_quad<unsigned_char,_int>_>::resize
                  (img,local_50,local_54,0xffffffff,
                   (color_quad<unsigned_char,_int> *)&local_34.field_0);
        if ((int)local_54 < 1) {
          uVar18 = 0x1f;
        }
        else {
          bVar10 = 1;
          bVar9 = 1;
          iVar12 = 0;
          do {
            if ((long)(int)local_50 != 0) {
              uVar14 = (ulong)(img->m_pitch * iVar12);
              pcVar6 = img->m_pPixels;
              iVar15 = local_50 * iVar12;
              lVar16 = 0;
              bVar9 = bVar10;
              do {
                sVar17 = retval_from_stbi_load[lVar16 + (long)iVar15 * 4 + 3];
                if ((iVar7 != 2) && (iVar7 != 4)) {
                  sVar17 = 0xff;
                }
                psVar2 = pcVar6[uVar14].field_0.c + lVar16;
                sVar3 = retval_from_stbi_load[lVar16 + (long)iVar15 * 4];
                sVar4 = retval_from_stbi_load[lVar16 + (long)iVar15 * 4 + 1];
                sVar5 = retval_from_stbi_load[lVar16 + (long)iVar15 * 4 + 2];
                *psVar2 = sVar3;
                psVar2[1] = sVar4;
                if (sVar4 != sVar5 || sVar3 != sVar4) {
                  bVar9 = 0;
                }
                psVar2[2] = sVar5;
                psVar2[3] = sVar17;
                lVar16 = lVar16 + 4;
                bVar10 = bVar9;
              } while ((color_quad<unsigned_char,_int> *)(psVar2 + 4) !=
                       pcVar6 + uVar14 + (long)(int)local_50);
            }
            iVar12 = iVar12 + 1;
          } while (iVar12 < (int)local_54);
          uVar18 = (uint)bVar9 << 4 | 0xf;
        }
        stbi_image_free(retval_from_stbi_load);
        uVar11 = uVar18 & 0xfffffff7;
        if ((uVar1 & 0xfffffffd) == 0) {
          uVar11 = uVar18;
        }
        img->m_comp_flags = uVar11;
        bVar13 = true;
        goto LAB_00119d81;
      }
      stbi_image_free(retval_from_stbi_load);
    }
    bVar13 = false;
  }
LAB_00119d81:
  if (local_48.m_p != (stbi_uc *)0x0) {
    crnlib_free(local_48.m_p);
  }
  return bVar13;
}

Assistant:

bool read_from_stream_stb(data_stream_serializer& serializer, image_u8& img) {
  uint8_vec buf;
  if (!serializer.read_entire_file(buf))
    return false;

  int x = 0, y = 0, n = 0;
  unsigned char* pData = stbi_load_from_memory(buf.get_ptr(), buf.size_in_bytes(), &x, &y, &n, 4);

  if (!pData)
    return false;

  if ((x > (int)CRNLIB_LARGEST_SUPPORTED_IMAGE_DIMENSION) || (y > (int)CRNLIB_LARGEST_SUPPORTED_IMAGE_DIMENSION)) {
    stbi_image_free(pData);
    return false;
  }

  const bool has_alpha = ((n == 2) || (n == 4));

  img.resize(x, y);

  bool grayscale = true;

  for (int py = 0; py < y; py++) {
    const color_quad_u8* pSrc = reinterpret_cast<const color_quad_u8*>(pData) + (py * x);
    color_quad_u8* pDst = img.get_scanline(py);
    color_quad_u8* pDst_end = pDst + x;

    while (pDst != pDst_end) {
      color_quad_u8 c(*pSrc++);
      if (!has_alpha)
        c.a = 255;

      if (!c.is_grayscale())
        grayscale = false;

      *pDst++ = c;
    }
  }

  stbi_image_free(pData);

  img.reset_comp_flags();
  img.set_grayscale(grayscale);
  img.set_component_valid(3, has_alpha);

  return true;
}